

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int check_frame_refs_short_signaling(AV1_COMMON *cm,_Bool enable_ref_short_signaling)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  AV1_COMMON *pAVar4;
  byte in_SIL;
  AV1_COMMON *in_RDI;
  RefCntBuffer *ref_frame_buf_new;
  int ref_idx;
  int frame_refs_short_signaling;
  int gld_map_idx;
  int lst_map_idx;
  int remapped_ref_idx_decoder [8];
  int i;
  int seen;
  RefCntBuffer *buf;
  int ref_frame;
  int num_refs;
  RefCntBuffer *seen_bufs [7];
  int relative_dist;
  int order_hint_group_gld;
  int order_hint_group_cur;
  int base;
  int gld_map_idx_1;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff3f;
  AV1_COMMON *in_stack_ffffffffffffff40;
  AV1_COMMON *cm_00;
  int local_b8;
  int local_b4;
  int local_a8 [10];
  int local_80;
  int local_7c;
  RefCntBuffer *local_78;
  int local_70;
  int local_6c;
  long local_68 [10];
  byte local_11;
  AV1_COMMON *local_10;
  int local_4;
  
  local_11 = in_SIL & 1;
  local_10 = in_RDI;
  if (local_11 == 0) {
    memset(local_68,0,0x38);
    local_6c = 0;
    for (local_70 = 1; local_70 < 8; local_70 = local_70 + 1) {
      local_78 = get_ref_frame_buf(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      if (local_78 != (RefCntBuffer *)0x0) {
        local_7c = 0;
        for (local_80 = 0; local_80 < local_6c; local_80 = local_80 + 1) {
          if ((RefCntBuffer *)local_68[local_80] == local_78) {
            local_7c = 1;
            break;
          }
        }
        if (local_7c == 0) {
          local_68[local_6c] = (long)local_78;
          local_6c = local_6c + 1;
        }
      }
    }
    if (local_6c < 7) {
      local_4 = 0;
    }
    else {
      get_ref_frame_map_idx(local_10,'\x01');
      get_ref_frame_map_idx(local_10,'\x04');
      av1_set_frame_refs((AV1_COMMON *)seen_bufs[4],&seen_bufs[3]->ref_count,seen_bufs[2]._4_4_,
                         (int)seen_bufs[2]);
      local_b4 = 1;
      for (local_b8 = 0; local_b8 < 7; local_b8 = local_b8 + 1) {
        cm_00 = (AV1_COMMON *)0x0;
        if (local_a8[local_b8] != -1) {
          cm_00 = (AV1_COMMON *)local_10->ref_frame_map[local_a8[local_b8]];
        }
        pAVar4 = (AV1_COMMON *)get_ref_frame_buf(cm_00,in_stack_ffffffffffffff3f);
        if (pAVar4 != cm_00) {
          local_b4 = 0;
          break;
        }
      }
      local_4 = local_b4;
    }
  }
  else {
    iVar1 = get_ref_frame_map_idx(in_RDI,'\x04');
    uVar2 = 1 << ((char)(local_10->seq_params->order_hint_info).order_hint_bits_minus_1 + 1U & 0x1f)
    ;
    iVar3 = (local_10->current_frame).order_hint - local_10->ref_frame_map[iVar1]->order_hint;
    if ((((local_10->current_frame).display_order_hint / uVar2 ==
          local_10->ref_frame_map[iVar1]->display_order_hint / uVar2) && (-1 < iVar3)) &&
       (iVar3 < 0x41)) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int check_frame_refs_short_signaling(AV1_COMMON *const cm,
                                            bool enable_ref_short_signaling) {
  // In rtc case when res < 360p and speed >= 9, we turn on
  // frame_refs_short_signaling if it won't break the decoder.
  if (enable_ref_short_signaling) {
    const int gld_map_idx = get_ref_frame_map_idx(cm, GOLDEN_FRAME);
    const int base =
        1 << (cm->seq_params->order_hint_info.order_hint_bits_minus_1 + 1);

    const int order_hint_group_cur =
        cm->current_frame.display_order_hint / base;
    const int order_hint_group_gld =
        cm->ref_frame_map[gld_map_idx]->display_order_hint / base;
    const int relative_dist = cm->current_frame.order_hint -
                              cm->ref_frame_map[gld_map_idx]->order_hint;

    // If current frame and GOLDEN frame are in the same order_hint group, and
    // they are not far apart (i.e., > 64 frames), then return 1.
    if (order_hint_group_cur == order_hint_group_gld && relative_dist >= 0 &&
        relative_dist <= 64) {
      return 1;
    }
    return 0;
  }

  // Check whether all references are distinct frames.
  const RefCntBuffer *seen_bufs[INTER_REFS_PER_FRAME] = { NULL };
  int num_refs = 0;
  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (buf != NULL) {
      int seen = 0;
      for (int i = 0; i < num_refs; i++) {
        if (seen_bufs[i] == buf) {
          seen = 1;
          break;
        }
      }
      if (!seen) seen_bufs[num_refs++] = buf;
    }
  }

  // We only turn on frame_refs_short_signaling when all references are
  // distinct.
  if (num_refs < INTER_REFS_PER_FRAME) {
    // It indicates that there exist more than one reference frame pointing to
    // the same reference buffer, i.e. two or more references are duplicate.
    return 0;
  }

  // Check whether the encoder side ref frame choices are aligned with that to
  // be derived at the decoder side.
  int remapped_ref_idx_decoder[REF_FRAMES];

  const int lst_map_idx = get_ref_frame_map_idx(cm, LAST_FRAME);
  const int gld_map_idx = get_ref_frame_map_idx(cm, GOLDEN_FRAME);

  // Set up the frame refs mapping indexes according to the
  // frame_refs_short_signaling policy.
  av1_set_frame_refs(cm, remapped_ref_idx_decoder, lst_map_idx, gld_map_idx);

  // We only turn on frame_refs_short_signaling when the encoder side decision
  // on ref frames is identical to that at the decoder side.
  int frame_refs_short_signaling = 1;
  for (int ref_idx = 0; ref_idx < INTER_REFS_PER_FRAME; ++ref_idx) {
    // Compare the buffer index between two reference frames indexed
    // respectively by the encoder and the decoder side decisions.
    RefCntBuffer *ref_frame_buf_new = NULL;
    if (remapped_ref_idx_decoder[ref_idx] != INVALID_IDX) {
      ref_frame_buf_new = cm->ref_frame_map[remapped_ref_idx_decoder[ref_idx]];
    }
    if (get_ref_frame_buf(cm, LAST_FRAME + ref_idx) != ref_frame_buf_new) {
      frame_refs_short_signaling = 0;
      break;
    }
  }

#if 0   // For debug
  printf("\nFrame=%d: \n", cm->current_frame.frame_number);
  printf("***frame_refs_short_signaling=%d\n", frame_refs_short_signaling);
  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    printf("enc_ref(map_idx=%d)=%d, vs. "
        "dec_ref(map_idx=%d)=%d\n",
        get_ref_frame_map_idx(cm, ref_frame), ref_frame,
        cm->remapped_ref_idx[ref_frame - LAST_FRAME],
        ref_frame);
  }
#endif  // 0

  return frame_refs_short_signaling;
}